

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

size_t tdefl_compress_mem_to_mem
                 (void *pOut_buf,size_t out_buf_len,void *pSrc_buf,size_t src_buf_len,int flags)

{
  mz_bool mVar1;
  void *local_58;
  tdefl_output_buffer out_buf;
  int flags_local;
  size_t src_buf_len_local;
  void *pSrc_buf_local;
  size_t out_buf_len_local;
  void *pOut_buf_local;
  
  out_buf._28_4_ = flags;
  memset(&local_58,0,0x20);
  if (pOut_buf == (void *)0x0) {
    pOut_buf_local = (void *)0x0;
  }
  else {
    out_buf.m_size = out_buf_len;
    out_buf.m_capacity = (size_t)pOut_buf;
    mVar1 = tdefl_compress_mem_to_output
                      (pSrc_buf,src_buf_len,tdefl_output_buffer_putter,&local_58,out_buf._28_4_);
    if (mVar1 == 0) {
      pOut_buf_local = (void *)0x0;
    }
    else {
      pOut_buf_local = local_58;
    }
  }
  return (size_t)pOut_buf_local;
}

Assistant:

size_t tdefl_compress_mem_to_mem(void *pOut_buf, size_t out_buf_len,
                                 const void *pSrc_buf, size_t src_buf_len,
                                 int flags) {
  tdefl_output_buffer out_buf;
  MZ_CLEAR_OBJ(out_buf);
  if (!pOut_buf)
    return 0;
  out_buf.m_pBuf = (mz_uint8 *)pOut_buf;
  out_buf.m_capacity = out_buf_len;
  if (!tdefl_compress_mem_to_output(
          pSrc_buf, src_buf_len, tdefl_output_buffer_putter, &out_buf, flags))
    return 0;
  return out_buf.m_size;
}